

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less *comp)

{
  char cVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  xpath_memory_block *na;
  xpath_node *pxVar5;
  bool bVar6;
  xpath_allocator_capture cr;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  xpath_allocator_capture cri;
  xpath_allocator_capture crii;
  xpath_allocator_capture local_e8;
  xpath_allocator *local_c8;
  xpath_memory_block *local_c0;
  xpath_memory_block *pxStack_b8;
  xpath_node *local_b0;
  xpath_node_set_raw local_a8;
  xpath_allocator_capture local_88;
  xpath_allocator_capture local_68;
  xpath_string local_48;
  
  cVar1 = lhs->_rettype;
  cVar2 = rhs->_rettype;
  if (cVar2 == '\x01' || cVar1 == '\x01') {
    if (cVar2 == '\x01' && cVar1 == '\x01') {
      local_e8._target = stack->result;
      local_e8._state._root = (local_e8._target)->_root;
      local_e8._state._root_size = (local_e8._target)->_root_size;
      local_e8._state._error = (local_e8._target)->_error;
      eval_node_set(&local_a8,lhs,c,stack,nodeset_eval_all);
      eval_node_set((xpath_node_set_raw *)&local_c8,rhs,c,stack,nodeset_eval_all);
      bVar6 = local_a8._begin != local_a8._end;
      if (bVar6) {
        bVar6 = true;
        pxVar5 = local_a8._begin;
        do {
          local_88._target = stack->result;
          local_88._state._error = (local_88._target)->_error;
          local_88._state._root = (local_88._target)->_root;
          local_88._state._root_size = (local_88._target)->_root_size;
          string_value((xpath_string *)&local_68,pxVar5,local_88._target);
          dVar3 = convert_string_to_number((char_t *)local_68._target);
          for (na = local_c0; na != pxStack_b8; na = (xpath_memory_block *)&na->field_2) {
            local_68._target = stack->result;
            local_68._state._error = (local_68._target)->_error;
            local_68._state._root = (local_68._target)->_root;
            local_68._state._root_size = (local_68._target)->_root_size;
            string_value(&local_48,(xpath_node *)na,local_68._target);
            dVar4 = convert_string_to_number(local_48._buffer);
            xpath_allocator_capture::~xpath_allocator_capture(&local_68);
            if (dVar3 < dVar4) {
              xpath_allocator_capture::~xpath_allocator_capture(&local_88);
              goto LAB_0012fd34;
            }
          }
          xpath_allocator_capture::~xpath_allocator_capture(&local_88);
          pxVar5 = pxVar5 + 1;
          bVar6 = pxVar5 != local_a8._end;
        } while (bVar6);
      }
    }
    else if (cVar1 == '\x01' || cVar2 != '\x01') {
      if (cVar2 == '\x01' || cVar1 != '\x01') {
        return false;
      }
      local_e8._target = stack->result;
      local_e8._state._root = (local_e8._target)->_root;
      local_e8._state._root_size = (local_e8._target)->_root_size;
      local_e8._state._error = (local_e8._target)->_error;
      eval_node_set(&local_a8,lhs,c,stack,nodeset_eval_all);
      dVar3 = eval_number(rhs,c,stack);
      bVar6 = local_a8._begin != local_a8._end;
      if (bVar6) {
        bVar6 = true;
        pxVar5 = local_a8._begin;
        do {
          local_c8 = stack->result;
          local_b0 = (xpath_node *)local_c8->_error;
          local_c0 = local_c8->_root;
          pxStack_b8 = (xpath_memory_block *)local_c8->_root_size;
          string_value((xpath_string *)&local_88,pxVar5,local_c8);
          dVar4 = convert_string_to_number((char_t *)local_88._target);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_c8);
          if (dVar4 < dVar3) break;
          pxVar5 = pxVar5 + 1;
          bVar6 = pxVar5 != local_a8._end;
        } while (bVar6);
      }
    }
    else {
      local_e8._target = stack->result;
      local_e8._state._root = (local_e8._target)->_root;
      local_e8._state._root_size = (local_e8._target)->_root_size;
      local_e8._state._error = (local_e8._target)->_error;
      dVar3 = eval_number(lhs,c,stack);
      eval_node_set(&local_a8,rhs,c,stack,nodeset_eval_all);
      bVar6 = local_a8._begin != local_a8._end;
      if (bVar6) {
        bVar6 = true;
        pxVar5 = local_a8._begin;
        do {
          local_c8 = stack->result;
          local_b0 = (xpath_node *)local_c8->_error;
          local_c0 = local_c8->_root;
          pxStack_b8 = (xpath_memory_block *)local_c8->_root_size;
          string_value((xpath_string *)&local_88,pxVar5,local_c8);
          dVar4 = convert_string_to_number((char_t *)local_88._target);
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&local_c8);
          if (dVar3 < dVar4) break;
          pxVar5 = pxVar5 + 1;
          bVar6 = pxVar5 != local_a8._end;
        } while (bVar6);
      }
    }
LAB_0012fd34:
    xpath_allocator_capture::~xpath_allocator_capture(&local_e8);
  }
  else {
    dVar3 = eval_number(lhs,c,stack);
    dVar4 = eval_number(rhs,c,stack);
    bVar6 = dVar3 < dVar4;
  }
  return bVar6;
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(false && "Wrong types"); // unreachable
				return false;
			}
		}